

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  long lVar2;
  unsigned_short *h;
  unsigned_short *h_00;
  value_type vVar3;
  ushort uVar4;
  unsigned_short *puVar5;
  size_t __n;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  unsigned_short uVar6;
  FP32 FVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  reference pvVar11;
  reference pvVar12;
  mz_ulong __n_00;
  reference pvVar13;
  reference pvVar14;
  value_type *pvVar15;
  ushort *__dest;
  reference pvVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  value_type *pvVar20;
  unsigned_short uVar21;
  ushort uVar22;
  long lVar23;
  pointer pPVar24;
  long lVar25;
  pointer plVar26;
  int y_2;
  ushort *puVar27;
  short sVar28;
  uint uVar29;
  reference pvVar30;
  pointer puVar31;
  FP16 h_01;
  ushort uVar32;
  int iVar33;
  int *piVar34;
  value_type *pvVar35;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  value_type vVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  int *piVar40;
  value_type *pvVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  int iVar46;
  size_t i;
  ulong uVar47;
  pointer plVar48;
  int y;
  ulong uVar49;
  ushort *puVar50;
  ushort *puVar51;
  uchar *b;
  pointer pPVar52;
  bool bVar53;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000001c;
  ushort local_1f8;
  uint local_1ec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  int local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_181;
  ushort *local_180;
  ushort *local_178;
  vector<long_long,_std::allocator<long_long>_> scode;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<long_long,_std::allocator<long_long>_> freq;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  
  lVar42 = (long)param_4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,x_stride * lVar42 * CONCAT44(in_stack_00000014,line_no),(allocator_type *)&tmpBuf)
  ;
  uVar47 = 0;
  uVar43 = 0;
  if (0 < param_4) {
    uVar43 = (ulong)(uint)param_4;
  }
  uVar9 = 0;
  if (0 < x_stride) {
    uVar9 = (ulong)(uint)x_stride;
  }
  lVar10 = (long)width;
  lVar23 = param_6 * lVar10 * 4;
  lVar25 = lVar10 * 4;
  pvVar30 = (reference)(param_6 * lVar10 * 2);
  local_178 = (ushort *)(lVar10 * 2);
  for (; lVar10 = *(long *)CONCAT44(in_stack_0000001c,num_lines),
      uVar47 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - lVar10) / 0x38);
      uVar47 = uVar47 + 1) {
    lVar2 = lVar10 + uVar47 * 0x38;
    iVar8 = *(int *)(lVar10 + 0x20 + uVar47 * 0x38);
    if (iVar8 == 2) {
      iVar8 = *(int *)(lVar2 + 0x24);
      if (iVar8 == 1) {
        lVar10 = lVar23;
        for (uVar49 = 0; uVar49 != uVar9; uVar49 = uVar49 + 1) {
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar49 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar47 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            uVar45 = *(uint *)(images[uVar47] + uVar19 * 4 + lVar10);
            uVar18 = uVar45 >> 0x17;
            uVar29 = uVar18 & 0xff;
            uVar32 = (ushort)uVar29;
            if ((char)uVar18 != '\0') {
              if (uVar29 == 0xff) {
                uVar32 = ((uVar45 & 0x7fffff) != 0 | 0x3e) << 9;
              }
              else {
                uVar32 = 0x7c00;
                if (uVar29 < 0x8f) {
                  if (uVar29 < 0x71) {
                    uVar32 = 0;
                    if (uVar29 < 0x66) goto LAB_00235868;
                    uVar37 = uVar45 & 0x7fffff | 0x800000;
                    uVar32 = (ushort)(uVar37 >> (0x7eU - (char)uVar18 & 0x1f));
                    uVar37 = uVar37 >> (0x7d - uVar29 & 0x1f);
                  }
                  else {
                    uVar32 = ((ushort)(uVar45 >> 0xd) & 0x3ff | (ushort)((uVar18 & 0x1f) << 10)) ^
                             0x4000;
                    uVar37 = uVar45 >> 0xc;
                  }
                  uVar32 = uVar32 + ((uVar37 & 1) != 0);
                }
LAB_00235868:
                uVar32 = uVar32 & 0x7fff;
              }
            }
            pvVar11[uVar19 * 2] = (value_type)uVar32;
            pvVar11[uVar19 * 2 + 1] = (byte)(uVar45 >> 0x18) & 0x80 | (byte)(uVar32 >> 8);
          }
          lVar10 = lVar10 + lVar25;
        }
      }
      else {
        if (iVar8 != 2) {
LAB_00235b30:
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
          goto LAB_00235b86;
        }
        lVar10 = lVar23;
        for (uVar49 = 0; uVar49 != uVar9; uVar49 = uVar49 + 1) {
          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar49 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar47 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined4 *)(pvVar11 + uVar19 * 4) =
                 *(undefined4 *)(images[uVar47] + uVar19 * 4 + lVar10);
          }
          lVar10 = lVar10 + lVar25;
        }
      }
    }
    else if (iVar8 == 1) {
      iVar8 = *(int *)(lVar2 + 0x24);
      if (iVar8 == 2) {
        pvVar11 = pvVar30;
        for (uVar49 = 0; uVar49 != uVar9; uVar49 = uVar49 + 1) {
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar49 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar47 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            h_01._2_2_ = 0;
            h_01.u = *(ushort *)(images[uVar47] + (long)pvVar11 + uVar19 * 2);
            FVar7 = half_to_float(h_01);
            *(FP32 *)(pvVar12 + uVar19 * 4) = FVar7;
          }
          pvVar11 = pvVar11 + (long)local_178;
        }
      }
      else {
        if (iVar8 != 1) goto LAB_00235b30;
        pvVar11 = pvVar30;
        for (uVar49 = 0; uVar49 != uVar9; uVar49 = uVar49 + 1) {
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar49 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar47 * 8)) * lVar42);
          for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined2 *)(pvVar12 + uVar19 * 2) =
                 *(undefined2 *)(images[uVar47] + (long)pvVar11 + uVar19 * 2);
          }
          pvVar11 = pvVar11 + (long)local_178;
        }
      }
    }
    else if (iVar8 == 0) {
      lVar10 = lVar23;
      for (uVar49 = 0; uVar49 != uVar9; uVar49 = uVar49 + 1) {
        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (&buf,(uVar49 * CONCAT44(in_stack_00000014,line_no) +
                                  *(long *)(*(long *)pixel_data_size + uVar47 * 8)) * lVar42);
        for (uVar19 = 0; uVar43 != uVar19; uVar19 = uVar19 + 1) {
          *(undefined4 *)(pvVar11 + uVar19 * 4) =
               *(undefined4 *)(images[uVar47] + uVar19 * 4 + lVar10);
        }
        lVar10 = lVar10 + lVar25;
      }
    }
  }
  if (compression_type != 0) {
    if ((compression_type & 0xfffffffeU) == 2) {
      __n_00 = mz_compressBound(CONCAT44(buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         (int)buf.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish) -
                                CONCAT44(buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)buf.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block,__n_00,(allocator_type *)&tmpBuf);
      lVar42 = -(long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
      plVar48 = (pointer)(CONCAT44(buf.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)buf.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&tmpBuf,(size_type)plVar48,(allocator_type *)&scode);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      lVar23 = 0;
      for (pvVar30 = pvVar12; pvVar30 < pvVar12 + (long)plVar48; pvVar30 = pvVar30 + 2) {
        pvVar13[lVar23] = *pvVar30;
        if (pvVar12 + (long)plVar48 <= pvVar30 + 1) break;
        pvVar14[lVar23 + ((ulong)((long)plVar48 + 1U) >> 1)] = pvVar30[1];
        lVar23 = lVar23 + 1;
      }
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      vVar36 = *pvVar15;
      while (pvVar15 = pvVar15 + 1, pvVar15 < pvVar30 + (long)plVar48) {
        vVar3 = *pvVar15;
        *pvVar15 = (vVar3 - vVar36) + 0x80;
        vVar36 = vVar3;
      }
      scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)plVar48);
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      iVar8 = mz_compress(pvVar11,(mz_ulong *)&scode,pvVar30,(mz_ulong)plVar48);
      plVar26 = (pointer)(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish + lVar42);
      if ((iVar8 == 0) &&
         (plVar26 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
         plVar48 <=
         scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_start)) {
        memcpy(pvVar11,pvVar12,(size_t)plVar48);
        plVar26 = plVar48;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (iVar8 == 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                   (const_iterator)
                   (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + ((ulong)plVar26 & 0xffffffff)));
      }
      else if (channels !=
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
        std::__cxx11::string::append((char *)channels);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (iVar8 == 0) goto LAB_002369fc;
    }
    else if (compression_type == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
    }
    else {
      if (compression_type == 4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block_2,(ulong)(((int)buf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
                   (allocator_type *)&tmpBuf);
        __dest = (ushort *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block_2,0);
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar43 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&bitmap,0x2000,(allocator_type *)&tmpBuf);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&tmpBuffer,uVar43 >> 1,(allocator_type *)&tmpBuf);
        std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
                  (&channelData,
                   (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                   *(long *)CONCAT44(in_stack_0000001c,num_lines)) / 0x38,(allocator_type *)&tmpBuf)
        ;
        pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        lVar42 = (long)channelData.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)channelData.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        piVar34 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
        piVar40 = &(channelData.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size;
        while (bVar53 = lVar42 != 0, lVar42 = lVar42 + -1, bVar53) {
          ((PIZChannelData *)(piVar40 + -7))->start = pvVar16;
          *(reference *)(piVar40 + -5) = pvVar16;
          piVar40[-3] = param_4;
          piVar40[-2] = x_stride;
          iVar8 = *piVar34;
          *piVar40 = (iVar8 != 1) + 1;
          pvVar16 = pvVar16 + (x_stride * param_4 << (iVar8 != 1));
          piVar34 = piVar34 + 0xe;
          piVar40 = piVar40 + 8;
        }
        pPVar24 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar11 = pvVar30;
        pPVar52 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_180 = __dest;
        for (iVar8 = 0; puVar27 = local_180, local_1d0 = (int)uVar9, iVar8 != local_1d0;
            iVar8 = iVar8 + 1) {
          lVar42 = 8;
          for (uVar47 = 0; uVar47 < (ulong)((long)pPVar24 - (long)pPVar52 >> 5); uVar47 = uVar47 + 1
              ) {
            lVar23 = (long)*(int *)((long)&pPVar52->ny + lVar42) *
                     (long)*(int *)((long)&pPVar52->end + lVar42);
            __n = lVar23 * 2;
            memcpy(*(void **)((long)&pPVar52->start + lVar42),pvVar11,__n);
            pvVar11 = pvVar11 + lVar23 * 2;
            plVar17 = (long *)((long)&pPVar52->start + lVar42);
            *plVar17 = *plVar17 + __n;
            lVar42 = lVar42 + 0x20;
            pPVar24 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar52 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        for (lVar42 = 0; lVar42 != 0x2000; lVar42 = lVar42 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar42] = '\0';
        }
        uVar9 = (ulong)((long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)tmpBuffer.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 1;
        uVar49 = 0;
        uVar47 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar47 = uVar49;
        }
        for (; uVar47 != uVar49; uVar49 = uVar49 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[pvVar16[uVar49] >> 3] =
               bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[pvVar16[uVar49] >> 3] |
               (byte)(1 << ((byte)pvVar16[uVar49] & 7));
        }
        *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start =
             *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfe;
        uVar47 = 0x1fff;
        uVar18 = 0;
        uVar45 = 0;
        uVar9 = 0;
        while( true ) {
          uVar49 = uVar47 & 0xffff;
          if (uVar9 == 0x2000) break;
          if (bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] != '\0') {
            uVar47 = uVar49;
            if (uVar9 < uVar49) {
              uVar47 = uVar9 & 0xffffffff;
              uVar45 = uVar18;
            }
            if ((uVar45 & 0xffff) < uVar9) {
              uVar45 = (uint)uVar9;
              uVar18 = (uint)uVar9;
            }
          }
          uVar9 = uVar9 + 1;
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&lut,0x10000,(allocator_type *)&tmpBuf);
        uVar9 = 0;
        uVar6 = 0;
        do {
          if (uVar9 == 0) {
LAB_00235f74:
            uVar21 = uVar6;
            uVar6 = uVar6 + 1;
          }
          else {
            if (uVar9 == 0x10000) goto LAB_00235f8d;
            if ((bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9 >> 3 & 0x1fffffff] >> ((uint)uVar9 & 7) & 1)
                != 0) goto LAB_00235f74;
            uVar21 = 0;
          }
          lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = uVar21;
          uVar9 = uVar9 + 1;
        } while( true );
      }
      if (compression_type == 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block,(ulong)((CONCAT44(buf.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                            (int)buf.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) -
                                  CONCAT44(buf.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)buf.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)) * 3) >>
                          1,(allocator_type *)&tmpBuf);
        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar43 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&tmpBuf,uVar43,(allocator_type *)&scode);
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        lVar42 = 0;
        for (pvVar30 = pvVar12; pvVar30 < pvVar12 + uVar43; pvVar30 = pvVar30 + 2) {
          pvVar13[lVar42] = *pvVar30;
          if (pvVar12 + uVar43 <= pvVar30 + 1) break;
          pvVar14[lVar42 + (uVar43 + 1 >> 1)] = pvVar30[1];
          lVar42 = lVar42 + 1;
        }
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        vVar36 = *pvVar15;
        while (pvVar15 = pvVar15 + 1, pvVar15 < pvVar30 + uVar43) {
          vVar3 = *pvVar15;
          *pvVar15 = (vVar3 - vVar36) + 0x80;
          vVar36 = vVar3;
        }
        pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar20 = pvVar30 + (int)uVar43;
        pvVar15 = pvVar30;
        pvVar13 = pvVar11;
        while (pvVar30 < pvVar20) {
          lVar42 = 0;
          pvVar41 = pvVar15;
          do {
            pvVar35 = pvVar41;
            pvVar41 = pvVar35 + 1;
            if (pvVar20 <= pvVar41) {
              lVar42 = 1 - lVar42;
              goto LAB_00235e2c;
            }
            lVar23 = lVar42 + ~(ulong)pvVar15;
            lVar42 = lVar42 + -1;
          } while ((-0x80 < (long)(pvVar30 + lVar23)) && (*pvVar30 == *pvVar41));
          lVar42 = -lVar42;
LAB_00235e2c:
          if ((long)(pvVar15 + (lVar42 - (long)pvVar30)) < 3) {
            vVar36 = (char)pvVar30 - (char)pvVar41;
            lVar42 = (long)pvVar41 - (long)pvVar30;
            for (pvVar35 = pvVar35 + 3; pvVar15 = pvVar35 + -2, pvVar15 < pvVar20;
                pvVar35 = pvVar35 + 1) {
              if (((pvVar35 + -1 < pvVar20) && (*pvVar15 == pvVar35[-1])) && (pvVar35 < pvVar20)) {
                if ((0x7e < lVar42) || (*pvVar15 == *pvVar35)) break;
              }
              else if (0x7e < lVar42) break;
              vVar36 = vVar36 + 0xff;
              lVar42 = lVar42 + 1;
            }
            *pvVar13 = vVar36;
            for (; pvVar13 = pvVar13 + 1, pvVar30 < pvVar15; pvVar30 = pvVar30 + 1) {
              *pvVar13 = *pvVar30;
            }
          }
          else {
            *pvVar13 = (char)(pvVar15 + (lVar42 - (long)pvVar30)) + 0xff;
            pvVar13[1] = *pvVar30;
            pvVar13 = pvVar13 + 2;
            pvVar30 = pvVar41;
            pvVar15 = pvVar41;
          }
        }
        uVar45 = (int)pvVar13 - (int)pvVar11;
        if ((int)uVar45 < 1) {
          __assert_fail("outSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                        ,0x650,
                        "void tinyexr::CompressRle(unsigned char *, tinyexr::tinyexr_uint64 &, const unsigned char *, unsigned long)"
                       );
        }
        uVar47 = (ulong)(uVar45 & 0x7fffffff);
        if (uVar43 <= uVar47) {
          memcpy(pvVar11,pvVar12,uVar43);
          uVar47 = uVar43;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                   (const_iterator)
                   (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar47));
        this = &block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
        goto LAB_002369f7;
      }
    }
LAB_00235b86:
    bVar53 = false;
    goto LAB_002369fe;
  }
  __first._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  __first._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  __last._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  __last._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,__first,__last);
  goto LAB_002369fc;
LAB_00235f8d:
  pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  local_1f8 = uVar6 - 1;
  applyLut(lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start,pvVar16,
           (int)((ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1));
  *__dest = (ushort)uVar47;
  __dest[1] = (ushort)uVar18;
  puVar27 = puVar27 + 2;
  if ((ushort)uVar47 <= (ushort)uVar18) {
    lVar42 = (uVar18 & 0xffff) - uVar49;
    memcpy(puVar27,bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar49,lVar42 + 1);
    puVar27 = (ushort *)((long)puVar27 + lVar42 + 1);
  }
  local_180 = puVar27;
  for (uVar47 = 0;
      uVar47 < (ulong)((long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar47 = uVar47 + 1) {
    pPVar24 = channelData.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar47;
    lVar42 = 0;
    for (lVar23 = 0; iVar8 = pPVar24->size, lVar23 < iVar8; lVar23 = lVar23 + 1) {
      puVar5 = pPVar24->start;
      uVar45 = pPVar24->nx;
      uVar18 = pPVar24->ny;
      iVar39 = uVar45 * iVar8;
      uVar29 = uVar18;
      if ((int)uVar45 < (int)uVar18) {
        uVar29 = uVar45;
      }
      local_1ec = 1;
      for (uVar37 = 2; (int)uVar37 <= (int)uVar29; uVar37 = uVar37 * 2) {
        iVar33 = (uVar45 - uVar37) * iVar8;
        lVar25 = (long)(int)(local_1ec * iVar8);
        lVar10 = (long)(int)(local_1ec * iVar39);
        puVar27 = (ushort *)(lVar25 * 2 + lVar10 * 2);
        local_178 = puVar27;
        for (puVar51 = (ushort *)((long)puVar5 + lVar42);
            puVar51 <= puVar5 + lVar23 + (int)((uVar18 - uVar37) * iVar39);
            puVar51 = puVar51 + (int)(uVar37 * iVar39)) {
          for (puVar50 = puVar51; puVar50 <= puVar51 + iVar33;
              puVar50 = puVar50 + (int)(uVar37 * iVar8)) {
            h = puVar50 + lVar10;
            h_00 = (unsigned_short *)((long)puVar50 + (long)puVar27);
            uVar32 = *puVar50;
            uVar4 = puVar50[lVar25];
            if (local_1f8 < 0x4000) {
              sVar28 = *h - *h_00;
              uVar38 = (int)(short)*h_00 + (int)(short)*h;
              *puVar50 = (unsigned_short)
                         ((uint)(((int)uVar38 >> 1) + ((int)(short)uVar4 + (int)(short)uVar32 >> 1))
                         >> 1);
              *h = (short)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1) -
                   (short)(uVar38 >> 1);
              puVar50[lVar25] =
                   (unsigned_short)((uint)((int)sVar28 + (int)(short)(uVar32 - uVar4)) >> 1);
              *h_00 = (uVar32 - uVar4) - sVar28;
            }
            else {
              uVar38 = (uVar32 ^ 0x8000) - (uint)uVar4 & 0x8000ffff;
              iVar46 = (*h ^ 0x8000) - (uint)*h_00;
              wenc16((ushort)(uVar38 >> 0x10) ^ (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1),
                     (ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                     (ushort)((uint)*h_00 + (*h ^ 0x8000) >> 1),puVar50,h);
              wenc16((unsigned_short)uVar38,(unsigned_short)iVar46,puVar50 + lVar25,h_00);
              puVar27 = local_178;
            }
          }
          if ((uVar45 & local_1ec) != 0) {
            uVar32 = *puVar50;
            uVar4 = puVar50[lVar10];
            if (local_1f8 < 0x4000) {
              uVar22 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1);
              iVar46 = (int)(short)uVar32 - (int)(short)uVar4;
            }
            else {
              iVar46 = (uVar32 ^ 0x8000) - (uint)uVar4;
              uVar22 = (ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                       (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            puVar50[lVar10] = (unsigned_short)iVar46;
            *puVar50 = uVar22;
          }
        }
        if ((uVar18 & local_1ec) != 0) {
          puVar27 = puVar51 + iVar33;
          for (; puVar51 <= puVar27; puVar51 = puVar51 + (int)(uVar37 * iVar8)) {
            uVar32 = *puVar51;
            uVar4 = puVar51[lVar25];
            if (local_1f8 < 0x4000) {
              uVar22 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar32) >> 1);
              iVar33 = (int)(short)uVar32 - (int)(short)uVar4;
            }
            else {
              iVar33 = (uVar32 ^ 0x8000) - (uint)uVar4;
              uVar22 = (ushort)((uint)iVar33 >> 0x10) & 0x8000 ^
                       (ushort)((uVar32 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            puVar51[lVar25] = (ushort)iVar33;
            *puVar51 = uVar22;
          }
        }
        local_1ec = uVar37;
      }
      lVar42 = lVar42 + 2;
      puVar27 = local_180;
    }
  }
  puVar27[0] = 0;
  puVar27[1] = 0;
  pvVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  puVar51 = puVar27 + 2;
  uVar47 = (ulong)((long)tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)tmpBuffer.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 1;
  iVar8 = (int)uVar47;
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&freq,0x10001,(allocator_type *)&tmpBuf);
    plVar48 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar42 = 0; lVar42 != 0x10001; lVar42 = lVar42 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar42] = 0;
    }
    uVar9 = 0;
    uVar49 = 0;
    if (0 < iVar8) {
      uVar49 = uVar47 & 0xffffffff;
    }
    for (; uVar49 != uVar9; uVar9 = uVar9 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[pvVar16[uVar9]] =
           freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start[pvVar16[uVar9]] + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&tmpBuf,0x10001,(allocator_type *)&block);
    std::vector<long_long_*,_std::allocator<long_long_*>_>::vector
              ((vector<long_long_*,_std::allocator<long_long_*>_> *)&block,0x10001,
               (allocator_type *)&scode);
    plVar17 = plVar48 + -1;
    uVar47 = 0xffffffffffffffff;
    do {
      uVar47 = uVar47 + 1;
      plVar1 = plVar17 + 1;
      plVar17 = plVar17 + 1;
    } while (*plVar1 == 0);
    uVar49 = 0;
    iVar39 = 0;
    for (uVar9 = uVar47; lVar42 = (long)iVar39, uVar9 < 0x10001; uVar9 = uVar9 + 1) {
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9 * 4) = (int)uVar9;
      if (*plVar17 != 0) {
        *(long **)(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar42 * 8) = plVar17;
        iVar39 = iVar39 + 1;
        uVar49 = uVar9 & 0xffffffff;
      }
      plVar17 = plVar17 + 1;
    }
    plVar48[(long)(int)uVar49 + 1] = 1;
    *(pointer *)
     (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + lVar42 * 8) = plVar48 + (long)(int)uVar49 + 1;
    std::make_heap<long_long**,tinyexr::FHeapCompare>
              (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar42 * 8 + 8);
    local_178 = puVar51;
    std::vector<long_long,_std::allocator<long_long>_>::vector(&scode,0x10001,&local_181);
    plVar26 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar42 = (long)(int)uVar49 + 1;
    memset(scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start,0,0x80008);
    uVar9 = (ulong)(iVar39 + 1);
    while (puVar50 = local_180, 1 < (int)uVar9) {
      lVar23 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8);
      lVar25 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8 + -8);
      uVar19 = (ulong)(lVar23 - (long)plVar48) >> 3;
      uVar49 = (ulong)(lVar25 - (long)plVar48) >> 3;
      plVar48[(int)uVar49] = plVar48[(int)uVar49] + plVar48[(int)uVar19];
      uVar9 = uVar9 - 1;
      std::push_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 * 8);
      do {
        uVar45 = (uint)uVar49;
        lVar25 = (long)(int)uVar45;
        lVar23 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25];
        scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = lVar23 + 1;
        if (0x39 < lVar23) {
          __assert_fail("scode[j] <= 58",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                        ,0x8f5,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
        }
        uVar49 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar25 * 4);
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar25 * 4) != uVar45);
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar25 * 4) = (int)uVar19;
      do {
        uVar45 = (uint)uVar19;
        lVar25 = (long)(int)uVar45;
        lVar23 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25];
        scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = lVar23 + 1;
        if (0x39 < lVar23) {
          __assert_fail("scode[j] <= 58",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                        ,0x908,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
        }
        uVar19 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar25 * 4);
        plVar26 = scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar25 * 4) != uVar45);
    }
    hufCanonicalCodeTable(plVar26);
    memcpy(plVar48,scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start,0x80008);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&scode.super__Vector_base<long_long,_std::allocator<long_long>_>);
    std::_Vector_base<long_long_*,_std::allocator<long_long_*>_>::~_Vector_base
              ((_Vector_base<long_long_*,_std::allocator<long_long_*>_> *)&block);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&tmpBuf);
    plVar48 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    uVar9 = uVar47 & 0xffffffff;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(puVar50 + 0xc);
    while (uVar45 = (uint)uVar9, (int)uVar45 <= (int)lVar42) {
      uVar49 = (ulong)(int)uVar45;
      uVar9 = plVar48[uVar49] & 0x3f;
      if (uVar9 == 0) {
        uVar19 = 0x3a;
        uVar44 = 0xfffffffb;
        while( true ) {
          uVar45 = (int)uVar44 + 6;
          if (((lVar42 <= (long)uVar49) || (0x104 < uVar45)) ||
             ((*(byte *)(plVar48 + uVar49 + 1) & 0x3f) != 0)) break;
          uVar49 = uVar49 + 1;
          uVar44 = (ulong)((int)uVar44 + 1);
          uVar19 = uVar19 + 1;
        }
        if (uVar45 < 2) {
          uVar45 = (uint)uVar49;
          goto LAB_0023674f;
        }
        iVar39 = 6;
        if (5 < uVar45) {
          outputBits(6,0x3f,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
          iVar39 = 8;
          uVar19 = uVar44;
        }
        outputBits(iVar39,uVar19,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
      }
      else {
LAB_0023674f:
        outputBits(6,uVar9,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
        uVar49 = (ulong)uVar45;
      }
      uVar9 = (ulong)((int)uVar49 + 1);
    }
    puVar31 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      puVar31 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0x3f));
    }
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar39 = 0;
    lVar23 = 1;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar31;
    while( true ) {
      uVar32 = pvVar16[lVar23 + -1];
      if (iVar8 <= lVar23) break;
      if (iVar39 < 0xff && uVar32 == pvVar16[lVar23]) {
        iVar39 = iVar39 + 1;
      }
      else {
        sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32],iVar39,
                 freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar42],(longlong *)&block,(int *)&scode,
                 (char **)&tmpBuf);
        iVar39 = 0;
      }
      lVar23 = lVar23 + 1;
    }
    sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar32],iVar39,
             freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42],(longlong *)&block,(int *)&scode,
             (char **)&tmpBuf);
    puVar51 = local_178;
    puVar27 = local_180;
    if ((int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) {
      iVar8 = 0;
    }
    else {
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0x3f));
      iVar8 = (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    iVar33 = (int)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start - (int)puVar31;
    *(value_type *)(local_180 + 2) = (value_type)uVar47;
    *(value_type *)((long)local_180 + 5) = (value_type)(uVar47 >> 8);
    *(value_type *)(local_180 + 3) = (value_type)(uVar47 >> 0x10);
    *(value_type *)((long)local_180 + 7) = (value_type)(uVar47 >> 0x18);
    *(value_type *)(local_180 + 4) = (value_type)lVar42;
    *(value_type *)((long)local_180 + 9) = (value_type)((ulong)lVar42 >> 8);
    *(value_type *)(local_180 + 5) = (value_type)((ulong)lVar42 >> 0x10);
    *(value_type *)((long)local_180 + 0xb) = (value_type)((ulong)lVar42 >> 0x18);
    lVar42 = (long)puVar31 - (long)(puVar50 + 0xc);
    *(value_type *)(local_180 + 6) = (value_type)lVar42;
    *(value_type *)((long)local_180 + 0xd) = (value_type)((ulong)lVar42 >> 8);
    *(value_type *)(local_180 + 7) = (value_type)((ulong)lVar42 >> 0x10);
    *(value_type *)((long)local_180 + 0xf) = (value_type)((ulong)lVar42 >> 0x18);
    iVar39 = iVar8 + iVar33 * 8;
    *(value_type *)(local_180 + 8) = (value_type)iVar39;
    *(value_type *)((long)local_180 + 0x11) = (value_type)((uint)iVar39 >> 8);
    *(value_type *)(local_180 + 9) = (value_type)((uint)iVar39 >> 0x10);
    *(value_type *)((long)local_180 + 0x13) = (value_type)((uint)iVar39 >> 0x18);
    iVar8 = ((iVar8 + iVar33 * 8 + 7) / 8 + (int)puVar31) - (int)local_178;
    local_180[10] = 0;
    local_180[0xb] = 0;
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&freq.super__Vector_base<long_long,_std::allocator<long_long>_>);
  }
  *(int *)puVar27 = iVar8;
  uVar47 = (ulong)(uint)(((int)puVar51 - (int)__dest) + iVar8);
  if (uVar43 <= uVar47) {
    memcpy(__dest,pvVar30,uVar43);
    uVar47 = uVar43;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
  ~_Vector_base(&channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
               );
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar47));
  this = &block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
LAB_002369f7:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
LAB_002369fc:
  bVar53 = true;
LAB_002369fe:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar53;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}